

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O1

Molecule * __thiscall OpenMD::SelectionManager::nthSelectedMolecule(SelectionManager *this,int *n)

{
  int iVar1;
  Molecule *pMVar2;
  
  iVar1 = OpenMDBitSet::nthOnBit
                    ((this->ss_).bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start + 5,(long)*n);
  if (iVar1 == -1) {
    pMVar2 = (Molecule *)0x0;
  }
  else {
    pMVar2 = (this->molecules_).
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_start[iVar1];
  }
  return pMVar2;
}

Assistant:

Molecule* SelectionManager::nthSelectedMolecule(int& n) {
    int i;
#ifdef IS_MPI
    i = ss_.bitsets_[MOLECULE].nthOnBit(n);
    if (i == -1) return NULL;
    // check that this processor owns this molecule
    if (molecules_[i] != NULL) return molecules_[i];
    return NULL;
#else
    i = ss_.bitsets_[MOLECULE].nthOnBit(n);
    return i == -1 ? NULL : molecules_[i];
#endif
  }